

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

int __thiscall miniros::Subscription::shutdown(Subscription *this,int __fd,int __how)

{
  int extraout_EAX;
  scoped_lock<std::mutex> lock;
  Subscription *in_stack_fffffffffffffff0;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffff0,(mutex_type *)this);
  this->shutting_down_ = true;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4cf848);
  drop(in_stack_fffffffffffffff0);
  return extraout_EAX;
}

Assistant:

void Subscription::shutdown()
{
  {
    std::scoped_lock<std::mutex> lock(shutdown_mutex_);
    shutting_down_ = true;
  }

  drop();
}